

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

shared_ptr<kratos::Expr> __thiscall kratos::util::mux(util *this,Var *cond,Var *left,Var *right)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  pair<std::__detail::_Node_iterator<std::shared_ptr<kratos::Expr>,_true,_false>,_bool> pVar4;
  shared_ptr<kratos::Expr> sVar5;
  shared_ptr<kratos::Var> local_70;
  shared_ptr<kratos::Var> local_60;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  shared_ptr<kratos::Var> local_40;
  undefined1 local_29;
  
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &cond->super_enable_shared_from_this<kratos::Var>);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_70,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &left->super_enable_shared_from_this<kratos::Var>);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_60,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &right->super_enable_shared_from_this<kratos::Var>);
  std::__shared_ptr<kratos::ConditionalExpr,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::ConditionalExpr>,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>>
            ((__shared_ptr<kratos::ConditionalExpr,(__gnu_cxx::_Lock_policy)2> *)&local_50,
             (allocator<kratos::ConditionalExpr> *)&local_29,&local_40,&local_70,&local_60);
  if (local_60.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_70.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_40.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  peVar1 = local_50;
  iVar2 = (*(cond->super_IRNode)._vptr_IRNode[0xd])(cond);
  peVar1->generator_ = (Generator *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(cond->super_IRNode)._vptr_IRNode[0xd])(cond);
  local_40.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_50;
  local_40.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_48;
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_48->_M_use_count = local_48->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_48->_M_use_count = local_48->_M_use_count + 1;
    }
  }
  pVar4 = std::
          _Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<std::shared_ptr<kratos::Expr>const&>
                    ((_Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)(CONCAT44(extraout_var_00,iVar2) + 400),&local_40);
  _Var3._M_pi = pVar4._8_8_;
  if (local_40.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var3._M_pi = extraout_RDX;
  }
  *(element_type **)this = local_50;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_48;
  sVar5.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  sVar5.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Expr>)
         sVar5.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expr> util::mux(Var &cond, Var &left, Var &right) {
    auto expr = std::make_shared<ConditionalExpr>(cond.shared_from_this(), left.shared_from_this(),
                                                  right.shared_from_this());
    expr->set_generator(cond.generator());
    cond.generator()->add_expr(expr);
    return expr;
}